

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regenc.c
# Opt level: O3

int onigenc_minimum_property_name_to_ctype(OnigEncoding enc,OnigUChar *p,OnigUChar *end)

{
  int iVar1;
  OnigCodePoint OVar2;
  PosixBracketEntryType *pPVar3;
  uint uVar4;
  OnigUChar *pOVar5;
  int iVar6;
  char *pcVar7;
  
  iVar6 = 0;
  if (p < end) {
    iVar6 = 0;
    pOVar5 = p;
    do {
      iVar1 = (*enc->mbc_enc_len)(pOVar5);
      pOVar5 = pOVar5 + iVar1;
      iVar6 = iVar6 + 1;
    } while (pOVar5 < end);
  }
  pPVar3 = onigenc_minimum_property_name_to_ctype::PBS;
  pcVar7 = "Alnum";
  do {
    if (iVar6 == pPVar3->len) {
      pOVar5 = p;
      uVar4 = iVar6 + 1;
      if (pPVar3->len < 1) {
LAB_0012b518:
        return pPVar3->ctype;
      }
      while (pOVar5 < end) {
        OVar2 = (*enc->mbc_to_code)(pOVar5,end);
        if (OVar2 != (byte)*pcVar7) goto LAB_0012b4ff;
        pcVar7 = (char *)((byte *)pcVar7 + 1);
        iVar1 = (*enc->mbc_enc_len)(pOVar5);
        uVar4 = uVar4 - 1;
        pOVar5 = pOVar5 + iVar1;
        if (uVar4 < 2) goto LAB_0012b518;
      }
      if (*pcVar7 == 0) goto LAB_0012b518;
    }
LAB_0012b4ff:
    pcVar7 = (char *)pPVar3[1].name;
    pPVar3 = pPVar3 + 1;
    if ((byte *)pcVar7 == (byte *)0x0) {
      return -0xdf;
    }
  } while( true );
}

Assistant:

extern int
onigenc_minimum_property_name_to_ctype(OnigEncoding enc, UChar* p, UChar* end)
{
  static PosixBracketEntryType PBS[] = {
    { (UChar* )"Alnum",  ONIGENC_CTYPE_ALNUM,  5 },
    { (UChar* )"Alpha",  ONIGENC_CTYPE_ALPHA,  5 },
    { (UChar* )"Blank",  ONIGENC_CTYPE_BLANK,  5 },
    { (UChar* )"Cntrl",  ONIGENC_CTYPE_CNTRL,  5 },
    { (UChar* )"Digit",  ONIGENC_CTYPE_DIGIT,  5 },
    { (UChar* )"Graph",  ONIGENC_CTYPE_GRAPH,  5 },
    { (UChar* )"Lower",  ONIGENC_CTYPE_LOWER,  5 },
    { (UChar* )"Print",  ONIGENC_CTYPE_PRINT,  5 },
    { (UChar* )"Punct",  ONIGENC_CTYPE_PUNCT,  5 },
    { (UChar* )"Space",  ONIGENC_CTYPE_SPACE,  5 },
    { (UChar* )"Upper",  ONIGENC_CTYPE_UPPER,  5 },
    { (UChar* )"XDigit", ONIGENC_CTYPE_XDIGIT, 6 },
    { (UChar* )"ASCII",  ONIGENC_CTYPE_ASCII,  5 },
    { (UChar* )"Word",   ONIGENC_CTYPE_WORD,   4 },
    { (UChar* )NULL, -1, 0 }
  };

  PosixBracketEntryType *pb;
  int len;

  len = onigenc_strlen(enc, p, end);
  for (pb = PBS; IS_NOT_NULL(pb->name); pb++) {
    if (len == pb->len &&
        onigenc_with_ascii_strncmp(enc, p, end, pb->name, pb->len) == 0)
      return pb->ctype;
  }

  return ONIGERR_INVALID_CHAR_PROPERTY_NAME;
}